

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.c
# Opt level: O2

char * preprocessor_print_info(void)

{
  return 
  "Preprocessor Library 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n"
  ;
}

Assistant:

const char *preprocessor_print_info(void)
{
	static const char preprocessor_info[] =
		"Preprocessor Library " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef PREPROCSSOR_STATIC_DEFINE
		"Compiled as static library type"
#else
		"Compiled as shared library type"
#endif

		"\n";

	return preprocessor_info;
}